

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclstubs.c
# Opt level: O0

void pnga_lu_solve_alt(Integer tran,Integer g_a,Integer g_b)

{
  Integer in_stack_00000188;
  char *in_stack_00000190;
  
  pnga_error(in_stack_00000190,in_stack_00000188);
  return;
}

Assistant:

void pnga_lu_solve_alt(Integer tran, Integer g_a, Integer g_b) {
#if HAVE_SCALAPACK
#   if ENABLE_F77
    void gai_lu_solve_alt_(Integer *tran, Integer *g_a, Integer *g_b);
    gai_lu_solve_alt_(&tran, &g_a, &g_b);
#   else
    pnga_error("ga_lu_solve:scalapack interfaced, need configure --enable-f77",0L);
#   endif
#else
    pnga_error("ga_lu_solve:scalapack not interfaced",0L);
#endif
}